

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_adios_mpi.cpp
# Opt level: O0

adios2_adios * adios2_init_config_glue_mpi(char *config_file,MPI_Comm comm,char *host_language)

{
  ADIOS *pAVar1;
  char *in_RDX;
  char *in_RDI;
  adios2_adios *adios;
  allocator local_a9;
  string local_a8 [32];
  ompi_communicator_t local_88 [15];
  allocator local_79;
  string local_78 [32];
  string *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  allocator local_41;
  string local_40 [32];
  ADIOS *local_20;
  char *local_18;
  char *local_8;
  
  local_20 = (ADIOS *)0x0;
  local_18 = in_RDX;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_40,"for config_file, in call to adios2_init or adios2_init_config",&local_41);
  adios2::helper::CheckForNullptr<char_const>(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  pAVar1 = (ADIOS *)operator_new(0x580);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,local_8,&local_79);
  adios2::helper::CommDupMPI(local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,local_18,&local_a9);
  adios2::core::ADIOS::ADIOS(pAVar1,local_78,local_88,local_a8);
  local_20 = pAVar1;
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  adios2::helper::Comm::~Comm((Comm *)local_88);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  return (adios2_adios *)local_20;
}

Assistant:

adios2_adios *adios2_init_config_glue_mpi(const char *config_file, MPI_Comm comm,
                                          const char *host_language)
{
    adios2_adios *adios = nullptr;

    try
    {
        adios2::helper::CheckForNullptr(
            config_file, "for config_file, in call to adios2_init or adios2_init_config");
        adios = reinterpret_cast<adios2_adios *>(
            new adios2::core::ADIOS(config_file, adios2::helper::CommDupMPI(comm), host_language));
    }
    catch (...)
    {
        adios2::helper::ExceptionToError("adios2_init or adios2_init_config");
    }
    return adios;
}